

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_app_writer.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  mbedtls_pk_type_t mVar4;
  char *pcVar5;
  FILE *pFVar6;
  size_t sVar7;
  mbedtls_mpi *X;
  char *pcVar8;
  char *__s1;
  long lVar9;
  uchar *puVar10;
  mbedtls_pk_context key;
  char buf [1024];
  uchar local_3eb8 [15999];
  uchar auStack_39 [9];
  
  mbedtls_pk_init(&key);
  memset(buf,0,0x400);
  if (argc == 0) {
LAB_0010a5b0:
    printf(
          "\n usage: key_app param=<>...\n\n acceptable parameters:\n    mode=private|public default: none\n    filename=%%s         default: keyfile.key\n    output_mode=private|public default: none\n    output_file=%%s      default: keyfile.pem\n    output_format=pem|der default: pem\n\n"
          );
LAB_0010a5be:
    uVar3 = 1;
    goto LAB_0010a5c1;
  }
  opt.mode = 0;
  opt.filename = "keyfile.key";
  opt.output_mode = 0;
  opt.output_file = "keyfile.pem";
  opt.output_format = 0;
  for (lVar9 = 1; lVar9 < argc; lVar9 = lVar9 + 1) {
    pcVar8 = argv[lVar9];
    pcVar5 = strchr(pcVar8,0x3d);
    if (pcVar5 == (char *)0x0) goto LAB_0010a5b0;
    __s1 = pcVar5 + 1;
    *pcVar5 = '\0';
    iVar2 = strcmp(pcVar8,"mode");
    if (iVar2 == 0) {
      iVar2 = strcmp(__s1,"private");
      if (iVar2 == 0) {
        opt.mode = 1;
        pcVar5 = opt.filename;
        pcVar1 = opt.output_file;
      }
      else {
        iVar2 = strcmp(__s1,"public");
        if (iVar2 != 0) goto LAB_0010a5b0;
        opt.mode = 2;
        pcVar5 = opt.filename;
        pcVar1 = opt.output_file;
      }
    }
    else {
      iVar2 = strcmp(pcVar8,"output_mode");
      if (iVar2 == 0) {
        iVar2 = strcmp(__s1,"private");
        if (iVar2 == 0) {
          opt.output_mode = 1;
          pcVar5 = opt.filename;
          pcVar1 = opt.output_file;
        }
        else {
          iVar2 = strcmp(__s1,"public");
          if (iVar2 != 0) goto LAB_0010a5b0;
          opt.output_mode = 2;
          pcVar5 = opt.filename;
          pcVar1 = opt.output_file;
        }
      }
      else {
        iVar2 = strcmp(pcVar8,"output_format");
        if (iVar2 == 0) {
          iVar2 = strcmp(__s1,"pem");
          if (iVar2 == 0) {
            opt.output_format = 0;
            pcVar5 = opt.filename;
            pcVar1 = opt.output_file;
          }
          else {
            iVar2 = strcmp(__s1,"der");
            if (iVar2 != 0) goto LAB_0010a5b0;
            opt.output_format = 1;
            pcVar5 = opt.filename;
            pcVar1 = opt.output_file;
          }
        }
        else {
          iVar2 = strcmp(pcVar8,"filename");
          pcVar5 = __s1;
          pcVar1 = opt.output_file;
          if ((iVar2 != 0) &&
             (iVar2 = strcmp(pcVar8,"output_file"), pcVar5 = opt.filename, pcVar1 = __s1, iVar2 != 0
             )) goto LAB_0010a5b0;
        }
      }
    }
    opt.output_file = pcVar1;
    opt.filename = pcVar5;
  }
  if (opt.output_mode == 0 || opt.mode != 0) {
    if (opt.output_mode == 1 && opt.mode == 2) {
      pcVar8 = "\nCannot output a private key from a public key.";
      goto LAB_0010a4c7;
    }
    if (opt.mode != 1) {
      if (opt.mode != 2) goto LAB_0010a5b0;
      printf("\n  . Loading the public key ...");
      fflush(_stdout);
      uVar3 = mbedtls_pk_parse_public_keyfile(&key,opt.filename);
      if (uVar3 == 0) {
        puts(" ok");
        puts("  . Key information    ...");
        mVar4 = mbedtls_pk_get_type(&key);
        if (mVar4 == MBEDTLS_PK_RSA) {
          mbedtls_mpi_write_file("N: ",(mbedtls_mpi *)((long)key.pk_ctx + 0x10),0x10,(FILE *)0x0);
          X = (mbedtls_mpi *)((long)key.pk_ctx + 0x28);
          pcVar8 = "E: ";
        }
        else {
          mVar4 = mbedtls_pk_get_type(&key);
          if (mVar4 != MBEDTLS_PK_ECKEY) goto LAB_0010a7d5;
          mbedtls_mpi_write_file
                    ("Q(X): ",(mbedtls_mpi *)((long)key.pk_ctx + 0x110),0x10,(FILE *)0x0);
          mbedtls_mpi_write_file
                    ("Q(Y): ",(mbedtls_mpi *)((long)key.pk_ctx + 0x128),0x10,(FILE *)0x0);
          X = (mbedtls_mpi *)((long)key.pk_ctx + 0x140);
          pcVar8 = "Q(Z): ";
        }
        goto LAB_0010a7c7;
      }
      pcVar8 = " failed\n  !  mbedtls_pk_parse_public_key returned -0x%04x - %s\n\n";
LAB_0010a55f:
      mbedtls_strerror(uVar3,buf,0x400);
      printf(pcVar8,(ulong)-uVar3,buf);
      if (1 < uVar3) {
        mbedtls_strerror(uVar3,buf,0x400);
        printf(" - %s\n",buf);
        goto LAB_0010a5c1;
      }
      goto LAB_0010a5be;
    }
    printf("\n  . Loading the private key ...");
    fflush(_stdout);
    uVar3 = mbedtls_pk_parse_keyfile(&key,opt.filename,(char *)0x0);
    if (uVar3 != 0) {
      pcVar8 = " failed\n  !  mbedtls_pk_parse_keyfile returned -0x%04x - %s\n\n";
      goto LAB_0010a55f;
    }
    puts(" ok");
    puts("  . Key information    ...");
    mVar4 = mbedtls_pk_get_type(&key);
    if (mVar4 == MBEDTLS_PK_RSA) {
      mbedtls_mpi_write_file("N:  ",(mbedtls_mpi *)((long)key.pk_ctx + 0x10),0x10,(FILE *)0x0);
      mbedtls_mpi_write_file("E:  ",(mbedtls_mpi *)((long)key.pk_ctx + 0x28),0x10,(FILE *)0x0);
      mbedtls_mpi_write_file("D:  ",(mbedtls_mpi *)((long)key.pk_ctx + 0x40),0x10,(FILE *)0x0);
      mbedtls_mpi_write_file("P:  ",(mbedtls_mpi *)((long)key.pk_ctx + 0x58),0x10,(FILE *)0x0);
      mbedtls_mpi_write_file("Q:  ",(mbedtls_mpi *)((long)key.pk_ctx + 0x70),0x10,(FILE *)0x0);
      mbedtls_mpi_write_file("DP: ",(mbedtls_mpi *)((long)key.pk_ctx + 0x88),0x10,(FILE *)0x0);
      mbedtls_mpi_write_file("DQ:  ",(mbedtls_mpi *)((long)key.pk_ctx + 0xa0),0x10,(FILE *)0x0);
      X = (mbedtls_mpi *)((long)key.pk_ctx + 0xb8);
      pcVar8 = "QP:  ";
LAB_0010a7c7:
      mbedtls_mpi_write_file(pcVar8,X,0x10,(FILE *)0x0);
    }
    else {
      mVar4 = mbedtls_pk_get_type(&key);
      if (mVar4 == MBEDTLS_PK_ECKEY) {
        mbedtls_mpi_write_file("Q(X): ",(mbedtls_mpi *)((long)key.pk_ctx + 0x110),0x10,(FILE *)0x0);
        mbedtls_mpi_write_file("Q(Y): ",(mbedtls_mpi *)((long)key.pk_ctx + 0x128),0x10,(FILE *)0x0);
        mbedtls_mpi_write_file("Q(Z): ",(mbedtls_mpi *)((long)key.pk_ctx + 0x140),0x10,(FILE *)0x0);
        X = (mbedtls_mpi *)((long)key.pk_ctx + 0xf8);
        pcVar8 = "D   : ";
        goto LAB_0010a7c7;
      }
LAB_0010a7d5:
      puts("key type not supported yet");
    }
    pcVar8 = opt.output_file;
    if (opt.output_mode == 2) {
      memset(local_3eb8,0,16000);
      if (opt.output_format == 0) {
        puVar10 = local_3eb8;
        iVar2 = mbedtls_pk_write_pubkey_pem(&key,puVar10,16000);
        if (iVar2 == 0) {
          sVar7 = strlen((char *)puVar10);
          goto LAB_0010a866;
        }
      }
      else {
        uVar3 = mbedtls_pk_write_pubkey_der(&key,local_3eb8,16000);
        if (-1 < (int)uVar3) {
          sVar7 = (size_t)uVar3;
          puVar10 = auStack_39 + -sVar7;
LAB_0010a866:
          pFVar6 = fopen(pcVar8,"w");
          if (pFVar6 != (FILE *)0x0) {
            fwrite(puVar10,1,sVar7,pFVar6);
            fclose(pFVar6);
          }
        }
      }
    }
    pcVar8 = opt.output_file;
    uVar3 = 0;
    if (opt.output_mode != 1) goto LAB_0010a5c1;
    memset(local_3eb8,0,16000);
    if (opt.output_format == 0) {
      puVar10 = local_3eb8;
      iVar2 = mbedtls_pk_write_key_pem(&key,puVar10,16000);
      if (iVar2 == 0) {
        sVar7 = strlen((char *)puVar10);
        goto LAB_0010a925;
      }
    }
    else {
      uVar3 = mbedtls_pk_write_key_der(&key,local_3eb8,16000);
      if (-1 < (int)uVar3) {
        sVar7 = (size_t)uVar3;
        puVar10 = auStack_39 + -sVar7;
LAB_0010a925:
        pFVar6 = fopen(pcVar8,"w");
        if (pFVar6 != (FILE *)0x0) {
          fwrite(puVar10,1,sVar7,pFVar6);
          fclose(pFVar6);
        }
      }
    }
  }
  else {
    pcVar8 = "\nCannot output a key without reading one.";
LAB_0010a4c7:
    puts(pcVar8);
  }
  uVar3 = 0;
LAB_0010a5c1:
  mbedtls_pk_free(&key);
  return uVar3;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 0;
    mbedtls_pk_context key;
    char buf[1024];
    int i;
    char *p, *q;

    /*
     * Set to sane values
     */
    mbedtls_pk_init( &key );
    memset( buf, 0, sizeof( buf ) );

    if( argc == 0 )
    {
    usage:
        ret = 1;
        mbedtls_printf( USAGE );
        goto exit;
    }

    opt.mode                = DFL_MODE;
    opt.filename            = DFL_FILENAME;
    opt.output_mode         = DFL_OUTPUT_MODE;
    opt.output_file         = DFL_OUTPUT_FILENAME;
    opt.output_format       = DFL_OUTPUT_FORMAT;

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        if( strcmp( p, "mode" ) == 0 )
        {
            if( strcmp( q, "private" ) == 0 )
                opt.mode = MODE_PRIVATE;
            else if( strcmp( q, "public" ) == 0 )
                opt.mode = MODE_PUBLIC;
            else
                goto usage;
        }
        else if( strcmp( p, "output_mode" ) == 0 )
        {
            if( strcmp( q, "private" ) == 0 )
                opt.output_mode = OUTPUT_MODE_PRIVATE;
            else if( strcmp( q, "public" ) == 0 )
                opt.output_mode = OUTPUT_MODE_PUBLIC;
            else
                goto usage;
        }
        else if( strcmp( p, "output_format" ) == 0 )
        {
#if defined(MBEDTLS_PEM_WRITE_C)
            if( strcmp( q, "pem" ) == 0 )
                opt.output_format = OUTPUT_FORMAT_PEM;
            else
#endif
            if( strcmp( q, "der" ) == 0 )
                opt.output_format = OUTPUT_FORMAT_DER;
            else
                goto usage;
        }
        else if( strcmp( p, "filename" ) == 0 )
            opt.filename = q;
        else if( strcmp( p, "output_file" ) == 0 )
            opt.output_file = q;
        else
            goto usage;
    }

    if( opt.mode == MODE_NONE && opt.output_mode != OUTPUT_MODE_NONE )
    {
        mbedtls_printf( "\nCannot output a key without reading one.\n");
        goto exit;
    }

    if( opt.mode == MODE_PUBLIC && opt.output_mode == OUTPUT_MODE_PRIVATE )
    {
        mbedtls_printf( "\nCannot output a private key from a public key.\n");
        goto exit;
    }

    if( opt.mode == MODE_PRIVATE )
    {
        /*
         * 1.1. Load the key
         */
        mbedtls_printf( "\n  . Loading the private key ..." );
        fflush( stdout );

        ret = mbedtls_pk_parse_keyfile( &key, opt.filename, NULL );

        if( ret != 0 )
        {
            mbedtls_strerror( ret, (char *) buf, sizeof(buf) );
            mbedtls_printf( " failed\n  !  mbedtls_pk_parse_keyfile returned -0x%04x - %s\n\n", -ret, buf );
            goto exit;
        }

        mbedtls_printf( " ok\n" );

        /*
         * 1.2 Print the key
         */
        mbedtls_printf( "  . Key information    ...\n" );

#if defined(MBEDTLS_RSA_C)
        if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_RSA )
        {
            mbedtls_rsa_context *rsa = mbedtls_pk_rsa( key );
            mbedtls_mpi_write_file( "N:  ",  &rsa->N,  16, NULL );
            mbedtls_mpi_write_file( "E:  ",  &rsa->E,  16, NULL );
            mbedtls_mpi_write_file( "D:  ",  &rsa->D,  16, NULL );
            mbedtls_mpi_write_file( "P:  ",  &rsa->P,  16, NULL );
            mbedtls_mpi_write_file( "Q:  ",  &rsa->Q,  16, NULL );
            mbedtls_mpi_write_file( "DP: ",  &rsa->DP, 16, NULL );
            mbedtls_mpi_write_file( "DQ:  ", &rsa->DQ, 16, NULL );
            mbedtls_mpi_write_file( "QP:  ", &rsa->QP, 16, NULL );
        }
        else
#endif
#if defined(MBEDTLS_ECP_C)
        if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_ECKEY )
        {
            mbedtls_ecp_keypair *ecp = mbedtls_pk_ec( key );
            mbedtls_mpi_write_file( "Q(X): ", &ecp->Q.X, 16, NULL );
            mbedtls_mpi_write_file( "Q(Y): ", &ecp->Q.Y, 16, NULL );
            mbedtls_mpi_write_file( "Q(Z): ", &ecp->Q.Z, 16, NULL );
            mbedtls_mpi_write_file( "D   : ", &ecp->d  , 16, NULL );
        }
        else
#endif
            mbedtls_printf("key type not supported yet\n");

    }
    else if( opt.mode == MODE_PUBLIC )
    {
        /*
         * 1.1. Load the key
         */
        mbedtls_printf( "\n  . Loading the public key ..." );
        fflush( stdout );

        ret = mbedtls_pk_parse_public_keyfile( &key, opt.filename );

        if( ret != 0 )
        {
            mbedtls_strerror( ret, (char *) buf, sizeof(buf) );
            mbedtls_printf( " failed\n  !  mbedtls_pk_parse_public_key returned -0x%04x - %s\n\n", -ret, buf );
            goto exit;
        }

        mbedtls_printf( " ok\n" );

        /*
         * 1.2 Print the key
         */
        mbedtls_printf( "  . Key information    ...\n" );

#if defined(MBEDTLS_RSA_C)
        if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_RSA )
        {
            mbedtls_rsa_context *rsa = mbedtls_pk_rsa( key );
            mbedtls_mpi_write_file( "N: ", &rsa->N, 16, NULL );
            mbedtls_mpi_write_file( "E: ", &rsa->E, 16, NULL );
        }
        else
#endif
#if defined(MBEDTLS_ECP_C)
        if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_ECKEY )
        {
            mbedtls_ecp_keypair *ecp = mbedtls_pk_ec( key );
            mbedtls_mpi_write_file( "Q(X): ", &ecp->Q.X, 16, NULL );
            mbedtls_mpi_write_file( "Q(Y): ", &ecp->Q.Y, 16, NULL );
            mbedtls_mpi_write_file( "Q(Z): ", &ecp->Q.Z, 16, NULL );
        }
        else
#endif
            mbedtls_printf("key type not supported yet\n");
    }
    else
        goto usage;

    if( opt.output_mode == OUTPUT_MODE_PUBLIC )
    {
        write_public_key( &key, opt.output_file );
    }
    if( opt.output_mode == OUTPUT_MODE_PRIVATE )
    {
        write_private_key( &key, opt.output_file );
    }

exit:

    if( ret != 0 && ret != 1)
    {
#ifdef MBEDTLS_ERROR_C
        mbedtls_strerror( ret, buf, sizeof( buf ) );
        mbedtls_printf( " - %s\n", buf );
#else
        mbedtls_printf("\n");
#endif
    }

    mbedtls_pk_free( &key );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}